

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSaxFWLError.cpp
# Opt level: O0

void __thiscall
COLLADASaxFWL::SaxFWLError::SaxFWLError
          (SaxFWLError *this,ErrorType errorType,String *errorMessage,Severity severity)

{
  undefined4 in_ECX;
  string *in_RDX;
  undefined4 in_ESI;
  IError *in_RDI;
  
  IError::IError(in_RDI);
  in_RDI->_vptr_IError = (_func_int **)&PTR__SaxFWLError_00db4a88;
  *(undefined4 *)&in_RDI[1]._vptr_IError = in_ESI;
  *(undefined4 *)((long)&in_RDI[1]._vptr_IError + 4) = in_ECX;
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RDX);
  in_RDI[6]._vptr_IError = (_func_int **)0x0;
  in_RDI[7]._vptr_IError = (_func_int **)0x0;
  return;
}

Assistant:

SaxFWLError::SaxFWLError( ErrorType errorType, String errorMessage, IError::Severity severity )
		: mErrorType(errorType)
		, mSeverity(severity)
		, mErrorMessage(errorMessage)
		, mLineNumber(0)
		, mColumnNumber(0)
	{
	}